

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O3

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Initialize<spoa::InstructionSet<(spoa::Architecture)3,int>>
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,char *sequence,Graph *graph,
          uint64_t normal_matrix_width,uint64_t matrix_width,uint64_t matrix_height)

{
  undefined8 *puVar1;
  char cVar2;
  AlignmentSubtype AVar3;
  AlignmentType AVar4;
  pointer ppNVar5;
  long lVar6;
  __mxxxi *palVar7;
  Implementation *pIVar8;
  Node *pNVar9;
  pointer ppEVar10;
  pointer ppEVar11;
  byte bVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int *piVar17;
  long lVar18;
  ulong uVar19;
  undefined8 *puVar20;
  int iVar21;
  ulong uVar22;
  uint32_t uVar23;
  uint uVar24;
  const_iterator __begin5;
  ulong uVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar34 [32];
  __mxxxi alVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar33 [32];
  undefined1 auVar38 [32];
  undefined1 auVar42 [32];
  undefined1 auVar46 [32];
  
  alVar35 = in_ZMM2._0_32_;
  uVar23 = graph->num_codes_;
  if (uVar23 != 0) {
    auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    alVar35 = auVar47._0_32_;
    auVar48 = vpbroadcastq_avx512f();
    lVar18 = 0;
    uVar22 = 0;
    auVar32 = vpbroadcastd_avx512vl();
    do {
      if (matrix_width != 0) {
        uVar19 = 0;
        auVar29 = vpbroadcastb_avx512vl();
        uVar24 = 1;
        do {
          auVar49 = vpbroadcastq_avx512f();
          cVar2 = (this->super_AlignmentEngine).n_;
          auVar49 = vporq_avx512f(auVar49,auVar47);
          uVar13 = vpcmpuq_avx512f(auVar49,auVar48,1);
          auVar27 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(sequence + (uVar19 & 0xffffffff)));
          auVar28[1] = ((byte)(uVar13 >> 1) & 1) * auVar27[1];
          auVar28[0] = ((byte)uVar13 & 1) * auVar27[0];
          auVar28[2] = ((byte)(uVar13 >> 2) & 1) * auVar27[2];
          auVar28[3] = ((byte)(uVar13 >> 3) & 1) * auVar27[3];
          auVar28[4] = ((byte)(uVar13 >> 4) & 1) * auVar27[4];
          auVar28[5] = ((byte)(uVar13 >> 5) & 1) * auVar27[5];
          auVar28[6] = ((byte)(uVar13 >> 6) & 1) * auVar27[6];
          auVar28[7] = (char)(uVar13 >> 7) * auVar27[7];
          auVar28._8_8_ = 0;
          uVar25 = vpcmpeqb_avx512vl(auVar28,auVar29);
          auVar28 = vpbroadcastb_avx512vl
                              (ZEXT116(*(byte *)&this[2].super_AlignmentEngine._vptr_AlignmentEngine
                                      ));
          bVar26 = (bool)((byte)uVar25 & 1);
          auVar27[0] = bVar26 * auVar28[0] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar27[1] = bVar26 * auVar28[1] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar27[2] = bVar26 * auVar28[2] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar27[3] = bVar26 * auVar28[3] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar27[4] = bVar26 * auVar28[4] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar27[5] = bVar26 * auVar28[5] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar27[6] = bVar26 * auVar28[6] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 7) & 1);
          auVar27[7] = bVar26 * auVar28[7] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 8) & 1);
          auVar27[8] = bVar26 * auVar28[8] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 9) & 1);
          auVar27[9] = bVar26 * auVar28[9] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 10) & 1);
          auVar27[10] = bVar26 * auVar28[10] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 0xb) & 1);
          auVar27[0xb] = bVar26 * auVar28[0xb] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 0xc) & 1);
          auVar27[0xc] = bVar26 * auVar28[0xc] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 0xd) & 1);
          auVar27[0xd] = bVar26 * auVar28[0xd] | !bVar26 * cVar2;
          bVar26 = (bool)((byte)(uVar25 >> 0xe) & 1);
          auVar27[0xe] = bVar26 * auVar28[0xe] | !bVar26 * cVar2;
          bVar26 = SUB81(uVar25 >> 0xf,0);
          auVar27[0xf] = bVar26 * auVar28[0xf] | !bVar26 * cVar2;
          auVar33 = vpmovsxbd_avx512vl(auVar27);
          bVar26 = (bool)((byte)uVar13 & 1);
          auVar34._0_4_ = (uint)bVar26 * auVar33._0_4_ | (uint)!bVar26 * auVar32._0_4_;
          bVar26 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar34._4_4_ = (uint)bVar26 * auVar33._4_4_ | (uint)!bVar26 * auVar32._4_4_;
          bVar26 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar34._8_4_ = (uint)bVar26 * auVar33._8_4_ | (uint)!bVar26 * auVar32._8_4_;
          bVar26 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar34._12_4_ = (uint)bVar26 * auVar33._12_4_ | (uint)!bVar26 * auVar32._12_4_;
          bVar26 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar34._16_4_ = (uint)bVar26 * auVar33._16_4_ | (uint)!bVar26 * auVar32._16_4_;
          bVar26 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar34._20_4_ = (uint)bVar26 * auVar33._20_4_ | (uint)!bVar26 * auVar32._20_4_;
          bVar26 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar34._24_4_ = (uint)bVar26 * auVar33._24_4_ | (uint)!bVar26 * auVar32._24_4_;
          bVar26 = SUB81(uVar13 >> 7,0);
          auVar34._28_4_ = (uint)bVar26 * auVar33._28_4_ | (uint)!bVar26 * auVar32._28_4_;
          *(undefined1 (*) [32])
           ((long)*((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->sequence_profile + uVar19 * 4 + lVar18) = auVar34;
          uVar25 = (ulong)uVar24;
          uVar19 = uVar19 + 8;
          uVar24 = uVar24 + 1;
        } while (uVar25 < matrix_width);
        uVar23 = graph->num_codes_;
      }
      uVar22 = uVar22 + 1;
      lVar18 = lVar18 + matrix_width * 0x20;
    } while (uVar22 < uVar23);
  }
  ppNVar5 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar18 = (long)(graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar5;
  if (lVar18 != 0) {
    uVar22 = 0;
    lVar6 = *(long *)&(((this->pimpl_)._M_t.
                        super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        .
                        super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                       ._M_head_impl)->node_id_to_rank).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    do {
      *(int *)(lVar6 + (ulong)ppNVar5[uVar22]->id * 4) = (int)uVar22;
      uVar22 = uVar22 + 1;
    } while ((uVar22 & 0xffffffff) < (ulong)(lVar18 >> 3));
  }
  AVar3 = (this->super_AlignmentEngine).subtype_;
  if (AVar3 != kAffine) {
    if (AVar3 != kConvex) goto LAB_001183fa;
    if (matrix_width != 0) {
      uVar22 = 0;
      do {
        palVar7 = ((this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl)->O + uVar22;
        (*palVar7)[0] = -0x7ffffbff7ffffc00;
        (*palVar7)[1] = -0x7ffffbff7ffffc00;
        (*palVar7)[2] = -0x7ffffbff7ffffc00;
        (*palVar7)[3] = -0x7ffffbff7ffffc00;
        alVar35 = (__mxxxi)vpbroadcastd_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->Q[uVar22] = alVar35;
        auVar32 = vpbroadcastd_avx512vl();
        iVar21 = 7;
        do {
          auVar33 = vperm2i128_avx2(auVar32,auVar32,0x28);
          iVar21 = iVar21 + -1;
          auVar32 = vpalignr_avx2(auVar32,auVar33,0xc);
          palVar7 = ((this->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     .
                     super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl)->Q;
          alVar35 = (__mxxxi)vpaddd_avx2(auVar32,(undefined1  [32])palVar7[uVar22]);
          palVar7[uVar22] = alVar35;
        } while (iVar21 != 0);
        uVar22 = uVar22 + 1;
      } while ((uVar22 & 0xffffffff) < matrix_width);
    }
    pIVar8 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             .
             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl;
    lVar18 = *(long *)&(pIVar8->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(undefined4 *)(lVar18 + matrix_height * 8) = 0;
    if (1 < matrix_height) {
      auVar32._8_4_ = 0x80000400;
      auVar32._0_8_ = 0x8000040080000400;
      auVar32._12_4_ = 0x80000400;
      auVar32._16_4_ = 0x80000400;
      auVar32._20_4_ = 0x80000400;
      auVar32._24_4_ = 0x80000400;
      auVar32._28_4_ = 0x80000400;
      auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      ppNVar5 = (graph->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + matrix_height * 8;
      alVar35 = (__mxxxi)vpcmpeqd_avx2((undefined1  [32])alVar35,(undefined1  [32])alVar35);
      uVar22 = 1;
      do {
        uVar24 = (uint)(this->super_AlignmentEngine).c_;
        puVar20 = (undefined8 *)(ulong)uVar24;
        pNVar9 = ppNVar5[(int)uVar22 - 1];
        ppEVar10 = (pNVar9->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar11 = *(pointer *)
                    ((long)&(pNVar9->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar10 == ppEVar11) {
          iVar21 = (int)(this->super_AlignmentEngine).q_ - uVar24;
        }
        else {
          uVar19 = 0;
          auVar48 = vpbroadcastq_avx512f();
          auVar48 = vpsrlq_avx512f(auVar48,3);
          auVar33 = auVar32;
          do {
            auVar34 = auVar33;
            auVar49 = vpbroadcastq_avx512f();
            auVar49 = vporq_avx512f(auVar49,auVar47);
            uVar25 = vpcmpuq_avx512f(auVar49,auVar48,2);
            vmovdqu64_avx512f(*(undefined1 (*) [64])(ppEVar10 + uVar19));
            bVar12 = (byte)uVar25;
            uVar19 = uVar19 + 8;
            vpgatherqq_avx512f(*puVar20);
            auVar36 = vpgatherqd_avx512f(_DAT_3ffffffffffffff8);
            auVar33._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar36._4_4_;
            auVar33._0_4_ = (uint)(bVar12 & 1) * auVar36._0_4_;
            auVar33._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar36._8_4_;
            auVar33._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar36._12_4_;
            auVar33._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar36._16_4_;
            auVar33._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar36._20_4_;
            auVar33._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar36._24_4_;
            auVar33._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar36._28_4_;
            vpmovzxdq_avx512f(auVar33);
            auVar33 = vpgatherqd_avx512f(*(undefined8 *)
                                          (*(long *)&(pIVar8->node_id_to_rank).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          + (long)puVar20 * 4));
            auVar36._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar33._4_4_;
            auVar36._0_4_ = (uint)(bVar12 & 1) * auVar33._0_4_;
            auVar36._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar33._8_4_;
            auVar36._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar33._12_4_;
            auVar36._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar33._16_4_;
            auVar36._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar33._20_4_;
            auVar36._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar33._24_4_;
            auVar36._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar33._28_4_;
            auVar33 = vpsubd_avx2(auVar36,(undefined1  [32])alVar35);
            vpmovzxdq_avx512f(auVar33);
            auVar33 = vpgatherqd_avx512f(*(undefined8 *)(lVar18 + (long)puVar20 * 4));
            auVar37._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar33._4_4_;
            auVar37._0_4_ = (uint)(bVar12 & 1) * auVar33._0_4_;
            auVar37._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar33._8_4_;
            auVar37._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar33._12_4_;
            auVar37._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar33._16_4_;
            auVar37._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar33._20_4_;
            auVar37._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar33._24_4_;
            auVar37._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar33._28_4_;
            auVar33 = vpmaxsd_avx2(auVar34,auVar37);
          } while ((((ulong)((long)ppEVar11 + (-8 - (long)ppEVar10)) >> 3) + 8 & 0x3ffffffffffffff8)
                   != uVar19);
          auVar33 = vmovdqa32_avx512vl(auVar33);
          auVar29._0_4_ =
               (uint)(bVar12 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar34._0_4_;
          bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar29._4_4_ = (uint)bVar26 * auVar33._4_4_ | (uint)!bVar26 * auVar34._4_4_;
          bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar29._8_4_ = (uint)bVar26 * auVar33._8_4_ | (uint)!bVar26 * auVar34._8_4_;
          bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar29._12_4_ = (uint)bVar26 * auVar33._12_4_ | (uint)!bVar26 * auVar34._12_4_;
          bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar38._16_4_ = (uint)bVar26 * auVar33._16_4_ | (uint)!bVar26 * auVar34._16_4_;
          auVar38._0_16_ = auVar29;
          bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar38._20_4_ = (uint)bVar26 * auVar33._20_4_ | (uint)!bVar26 * auVar34._20_4_;
          bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar38._24_4_ = (uint)bVar26 * auVar33._24_4_ | (uint)!bVar26 * auVar34._24_4_;
          bVar26 = SUB81(uVar25 >> 7,0);
          auVar38._28_4_ = (uint)bVar26 * auVar33._28_4_ | (uint)!bVar26 * auVar34._28_4_;
          auVar29 = vpmaxsd_avx(auVar29,auVar38._16_16_);
          auVar28 = vpshufd_avx(auVar29,0xee);
          auVar29 = vpmaxsd_avx(auVar29,auVar28);
          auVar28 = vpshufd_avx(auVar29,0x55);
          auVar29 = vpmaxsd_avx(auVar29,auVar28);
          iVar21 = auVar29._0_4_;
        }
        uVar19 = (ulong)((int)uVar22 + 1);
        *(uint *)(lVar18 + uVar22 * 4) = iVar21 + uVar24;
        uVar22 = uVar19;
      } while (uVar19 < matrix_height);
    }
  }
  if (matrix_width != 0) {
    uVar22 = 0;
    do {
      palVar7 = ((this->pimpl_)._M_t.
                 super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                 .
                 super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl)->F + uVar22;
      (*palVar7)[0] = -0x7ffffbff7ffffc00;
      (*palVar7)[1] = -0x7ffffbff7ffffc00;
      (*palVar7)[2] = -0x7ffffbff7ffffc00;
      (*palVar7)[3] = -0x7ffffbff7ffffc00;
      alVar35 = (__mxxxi)vpbroadcastd_avx512vl();
      ((this->pimpl_)._M_t.
       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       ._M_t.
       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       .
       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
      ._M_head_impl)->E[uVar22] = alVar35;
      auVar32 = vpbroadcastd_avx512vl();
      iVar21 = 7;
      do {
        auVar33 = vperm2i128_avx2(auVar32,auVar32,0x28);
        iVar21 = iVar21 + -1;
        auVar32 = vpalignr_avx2(auVar32,auVar33,0xc);
        palVar7 = ((this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl)->E;
        alVar35 = (__mxxxi)vpaddd_avx2(auVar32,(undefined1  [32])palVar7[uVar22]);
        palVar7[uVar22] = alVar35;
      } while (iVar21 != 0);
      uVar22 = uVar22 + 1;
    } while ((uVar22 & 0xffffffff) < matrix_width);
  }
  pIVar8 = (this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           .
           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
           ._M_head_impl;
  lVar18 = *(long *)&(pIVar8->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  *(undefined4 *)(lVar18 + matrix_height * 4) = 0;
  if (1 < matrix_height) {
    auVar50._8_4_ = 0x80000400;
    auVar50._0_8_ = 0x8000040080000400;
    auVar50._12_4_ = 0x80000400;
    auVar50._16_4_ = 0x80000400;
    auVar50._20_4_ = 0x80000400;
    auVar50._24_4_ = 0x80000400;
    auVar50._28_4_ = 0x80000400;
    auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    ppNVar5 = (graph->rank_to_node_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar18 = lVar18 + matrix_height * 4;
    alVar35 = (__mxxxi)vpcmpeqd_avx2((undefined1  [32])alVar35,(undefined1  [32])alVar35);
    uVar22 = 1;
    do {
      uVar24 = (uint)(this->super_AlignmentEngine).e_;
      puVar20 = (undefined8 *)(ulong)uVar24;
      pNVar9 = ppNVar5[(int)uVar22 - 1];
      ppEVar10 = (pNVar9->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar11 = *(pointer *)
                  ((long)&(pNVar9->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      if (ppEVar10 == ppEVar11) {
        iVar21 = (int)(this->super_AlignmentEngine).g_ - uVar24;
      }
      else {
        uVar19 = 0;
        auVar48 = vpbroadcastq_avx512f();
        auVar48 = vpsrlq_avx512f(auVar48,3);
        auVar32 = auVar50;
        do {
          auVar33 = auVar32;
          auVar49 = vpbroadcastq_avx512f();
          auVar49 = vporq_avx512f(auVar49,auVar47);
          uVar25 = vpcmpuq_avx512f(auVar49,auVar48,2);
          vmovdqu64_avx512f(*(undefined1 (*) [64])(ppEVar10 + uVar19));
          bVar12 = (byte)uVar25;
          uVar19 = uVar19 + 8;
          vpgatherqq_avx512f(*puVar20);
          auVar32 = vpgatherqd_avx512f(_DAT_3ffffffffffffff8);
          auVar39._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar32._4_4_;
          auVar39._0_4_ = (uint)(bVar12 & 1) * auVar32._0_4_;
          auVar39._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar32._8_4_;
          auVar39._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar32._12_4_;
          auVar39._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar32._16_4_;
          auVar39._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar32._20_4_;
          auVar39._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar32._24_4_;
          auVar39._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar32._28_4_;
          vpmovzxdq_avx512f(auVar39);
          auVar32 = vpgatherqd_avx512f(*(undefined8 *)
                                        (*(long *)&(pIVar8->node_id_to_rank).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        + (long)puVar20 * 4));
          auVar40._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar32._4_4_;
          auVar40._0_4_ = (uint)(bVar12 & 1) * auVar32._0_4_;
          auVar40._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar32._8_4_;
          auVar40._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar32._12_4_;
          auVar40._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar32._16_4_;
          auVar40._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar32._20_4_;
          auVar40._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar32._24_4_;
          auVar40._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar32._28_4_;
          auVar32 = vpsubd_avx2(auVar40,(undefined1  [32])alVar35);
          vpmovzxdq_avx512f(auVar32);
          auVar32 = vpgatherqd_avx512f(*(undefined8 *)(lVar18 + (long)puVar20 * 4));
          auVar41._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar32._4_4_;
          auVar41._0_4_ = (uint)(bVar12 & 1) * auVar32._0_4_;
          auVar41._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar32._8_4_;
          auVar41._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar32._12_4_;
          auVar41._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar32._16_4_;
          auVar41._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar32._20_4_;
          auVar41._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar32._24_4_;
          auVar41._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar32._28_4_;
          auVar32 = vpmaxsd_avx2(auVar33,auVar41);
        } while ((((ulong)((long)ppEVar11 + (-8 - (long)ppEVar10)) >> 3) + 8 & 0x3ffffffffffffff8)
                 != uVar19);
        auVar32 = vmovdqa32_avx512vl(auVar32);
        auVar30._0_4_ =
             (uint)(bVar12 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar33._0_4_;
        bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar26 * auVar32._4_4_ | (uint)!bVar26 * auVar33._4_4_;
        bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar26 * auVar32._8_4_ | (uint)!bVar26 * auVar33._8_4_;
        bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar26 * auVar32._12_4_ | (uint)!bVar26 * auVar33._12_4_;
        bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar26 * auVar32._16_4_ | (uint)!bVar26 * auVar33._16_4_;
        auVar42._0_16_ = auVar30;
        bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar26 * auVar32._20_4_ | (uint)!bVar26 * auVar33._20_4_;
        bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar26 * auVar32._24_4_ | (uint)!bVar26 * auVar33._24_4_;
        bVar26 = SUB81(uVar25 >> 7,0);
        auVar42._28_4_ = (uint)bVar26 * auVar32._28_4_ | (uint)!bVar26 * auVar33._28_4_;
        auVar29 = vpmaxsd_avx(auVar30,auVar42._16_16_);
        auVar28 = vpshufd_avx(auVar29,0xee);
        auVar29 = vpmaxsd_avx(auVar29,auVar28);
        auVar28 = vpshufd_avx(auVar29,0x55);
        auVar29 = vpmaxsd_avx(auVar29,auVar28);
        iVar21 = auVar29._0_4_;
      }
      uVar19 = (ulong)((int)uVar22 + 1);
      *(uint *)(lVar18 + uVar22 * 4) = iVar21 + uVar24;
      uVar22 = uVar19;
    } while (uVar19 < matrix_height);
  }
LAB_001183fa:
  AVar4 = (this->super_AlignmentEngine).type_;
  if (AVar4 == kOV) {
    AVar3 = (this->super_AlignmentEngine).subtype_;
    if (AVar3 == kConvex) {
      if (matrix_width != 0) {
        uVar24 = 1;
        lVar18 = 0;
        do {
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl;
          auVar32 = vpmaxsd_avx2(*(undefined1 (*) [32])((long)*pIVar8->E + lVar18),
                                 *(undefined1 (*) [32])((long)*pIVar8->Q + lVar18));
          uVar22 = (ulong)uVar24;
          uVar24 = uVar24 + 1;
          *(undefined1 (*) [32])((long)*pIVar8->H + lVar18) = auVar32;
          lVar18 = lVar18 + 0x20;
        } while (uVar22 < matrix_width);
      }
    }
    else if (AVar3 == kAffine) {
      if (matrix_width != 0) {
        uVar24 = 1;
        lVar18 = 0;
        do {
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl;
          puVar20 = (undefined8 *)((long)*pIVar8->E + lVar18);
          uVar14 = puVar20[1];
          uVar15 = puVar20[2];
          uVar16 = puVar20[3];
          uVar22 = (ulong)uVar24;
          uVar24 = uVar24 + 1;
          puVar1 = (undefined8 *)((long)*pIVar8->H + lVar18);
          *puVar1 = *puVar20;
          puVar1[1] = uVar14;
          puVar1[2] = uVar15;
          puVar1[3] = uVar16;
          lVar18 = lVar18 + 0x20;
        } while (uVar22 < matrix_width);
      }
    }
    else if ((AVar3 == kLinear) && (matrix_width != 0)) {
      uVar22 = 0;
      do {
        alVar35 = (__mxxxi)vpbroadcastd_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->H[uVar22] = alVar35;
        auVar32 = vpbroadcastd_avx512vl();
        iVar21 = 7;
        do {
          auVar33 = vperm2i128_avx2(auVar32,auVar32,0x28);
          iVar21 = iVar21 + -1;
          auVar32 = vpalignr_avx2(auVar32,auVar33,0xc);
          palVar7 = ((this->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     .
                     super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl)->H;
          alVar35 = (__mxxxi)vpaddd_avx2(auVar32,(undefined1  [32])palVar7[uVar22]);
          palVar7[uVar22] = alVar35;
        } while (iVar21 != 0);
        uVar22 = uVar22 + 1;
      } while ((uVar22 & 0xffffffff) < matrix_width);
    }
    if (matrix_height != 0) {
      uVar22 = 0;
      lVar18 = *(long *)&(((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->first_column).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      do {
        *(undefined4 *)(lVar18 + uVar22 * 4) = 0;
        uVar22 = uVar22 + 1;
      } while ((uVar22 & 0xffffffff) < matrix_height);
    }
  }
  else if (AVar4 == kNW) {
    AVar3 = (this->super_AlignmentEngine).subtype_;
    if (AVar3 == kLinear) {
      pIVar8 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      puVar20 = *(undefined8 **)
                 &(pIVar8->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      *(undefined4 *)puVar20 = 0;
      if (1 < matrix_height) {
        auVar51._8_4_ = 0x80000400;
        auVar51._0_8_ = 0x8000040080000400;
        auVar51._12_4_ = 0x80000400;
        auVar51._16_4_ = 0x80000400;
        auVar51._20_4_ = 0x80000400;
        auVar51._24_4_ = 0x80000400;
        auVar51._28_4_ = 0x80000400;
        auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        ppNVar5 = (graph->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        cVar2 = (this->super_AlignmentEngine).g_;
        auVar32 = vpcmpeqd_avx2((undefined1  [32])alVar35,(undefined1  [32])alVar35);
        uVar22 = 1;
        do {
          iVar21 = 0;
          pNVar9 = ppNVar5[(int)uVar22 - 1];
          ppEVar10 = (pNVar9->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar11 = *(pointer *)
                      ((long)&(pNVar9->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          if (ppEVar10 != ppEVar11) {
            uVar19 = 0;
            auVar48 = vpbroadcastq_avx512f();
            auVar48 = vpsrlq_avx512f(auVar48,3);
            auVar33 = auVar51;
            do {
              auVar34 = auVar33;
              auVar49 = vpbroadcastq_avx512f();
              auVar49 = vporq_avx512f(auVar49,auVar47);
              uVar25 = vpcmpuq_avx512f(auVar49,auVar48,2);
              vmovdqu64_avx512f(*(undefined1 (*) [64])(ppEVar10 + uVar19));
              bVar12 = (byte)uVar25;
              uVar19 = uVar19 + 8;
              vpgatherqq_avx512f(uRam0000000000000000);
              auVar33 = vpgatherqd_avx512f(_DAT_3ffffffffffffff8);
              auVar43._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar33._4_4_;
              auVar43._0_4_ = (uint)(bVar12 & 1) * auVar33._0_4_;
              auVar43._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar33._8_4_;
              auVar43._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar33._12_4_;
              auVar43._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar33._16_4_;
              auVar43._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar33._20_4_;
              auVar43._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar33._24_4_;
              auVar43._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar33._28_4_;
              vpmovzxdq_avx512f(auVar43);
              auVar33 = vpgatherqd_avx512f(**(undefined8 **)
                                             &(pIVar8->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          );
              auVar44._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar33._4_4_;
              auVar44._0_4_ = (uint)(bVar12 & 1) * auVar33._0_4_;
              auVar44._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar33._8_4_;
              auVar44._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar33._12_4_;
              auVar44._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar33._16_4_;
              auVar44._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar33._20_4_;
              auVar44._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar33._24_4_;
              auVar44._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar33._28_4_;
              auVar33 = vpsubd_avx2(auVar44,auVar32);
              vpmovzxdq_avx512f(auVar33);
              auVar33 = vpgatherqd_avx512f(*puVar20);
              auVar45._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar33._4_4_;
              auVar45._0_4_ = (uint)(bVar12 & 1) * auVar33._0_4_;
              auVar45._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar33._8_4_;
              auVar45._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar33._12_4_;
              auVar45._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar33._16_4_;
              auVar45._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar33._20_4_;
              auVar45._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar33._24_4_;
              auVar45._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar33._28_4_;
              auVar33 = vpmaxsd_avx2(auVar34,auVar45);
            } while ((((ulong)((long)ppEVar11 + (-8 - (long)ppEVar10)) >> 3) + 8 &
                     0x3ffffffffffffff8) != uVar19);
            auVar33 = vmovdqa32_avx512vl(auVar33);
            auVar31._0_4_ =
                 (uint)(bVar12 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar34._0_4_;
            bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar31._4_4_ = (uint)bVar26 * auVar33._4_4_ | (uint)!bVar26 * auVar34._4_4_;
            bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar31._8_4_ = (uint)bVar26 * auVar33._8_4_ | (uint)!bVar26 * auVar34._8_4_;
            bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
            auVar31._12_4_ = (uint)bVar26 * auVar33._12_4_ | (uint)!bVar26 * auVar34._12_4_;
            bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
            auVar46._16_4_ = (uint)bVar26 * auVar33._16_4_ | (uint)!bVar26 * auVar34._16_4_;
            auVar46._0_16_ = auVar31;
            bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
            auVar46._20_4_ = (uint)bVar26 * auVar33._20_4_ | (uint)!bVar26 * auVar34._20_4_;
            bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
            auVar46._24_4_ = (uint)bVar26 * auVar33._24_4_ | (uint)!bVar26 * auVar34._24_4_;
            bVar26 = SUB81(uVar25 >> 7,0);
            auVar46._28_4_ = (uint)bVar26 * auVar33._28_4_ | (uint)!bVar26 * auVar34._28_4_;
            auVar29 = vpmaxsd_avx(auVar31,auVar46._16_16_);
            auVar28 = vpshufd_avx(auVar29,0xee);
            auVar29 = vpmaxsd_avx(auVar29,auVar28);
            auVar28 = vpshufd_avx(auVar29,0x55);
            auVar29 = vpmaxsd_avx(auVar29,auVar28);
            iVar21 = auVar29._0_4_;
          }
          uVar19 = (ulong)((int)uVar22 + 1);
          *(int *)((long)puVar20 + uVar22 * 4) = iVar21 + cVar2;
          uVar22 = uVar19;
        } while (uVar19 < matrix_height);
      }
      if (matrix_width != 0) {
        uVar22 = 0;
        do {
          alVar35 = (__mxxxi)vpbroadcastd_avx512vl();
          ((this->pimpl_)._M_t.
           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           .
           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
          ._M_head_impl)->H[uVar22] = alVar35;
          auVar32 = vpbroadcastd_avx512vl();
          iVar21 = 7;
          do {
            auVar33 = vperm2i128_avx2(auVar32,auVar32,0x28);
            iVar21 = iVar21 + -1;
            auVar32 = vpalignr_avx2(auVar32,auVar33,0xc);
            palVar7 = ((this->pimpl_)._M_t.
                       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                       .
                       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                      ._M_head_impl)->H;
            alVar35 = (__mxxxi)vpaddd_avx2(auVar32,(undefined1  [32])palVar7[uVar22]);
            palVar7[uVar22] = alVar35;
          } while (iVar21 != 0);
          uVar22 = uVar22 + 1;
        } while ((uVar22 & 0xffffffff) < matrix_width);
      }
    }
    else if (AVar3 == kConvex) {
      if (matrix_height != 0) {
        piVar17 = *(int **)&(((this->pimpl_)._M_t.
                              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              .
                              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                             ._M_head_impl)->first_column).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        uVar22 = 1;
        do {
          iVar21 = piVar17[matrix_height * 2];
          if (piVar17[matrix_height * 2] < piVar17[matrix_height]) {
            iVar21 = piVar17[matrix_height];
          }
          *piVar17 = iVar21;
          piVar17 = piVar17 + 1;
          bVar26 = uVar22 < matrix_height;
          uVar22 = (ulong)((int)uVar22 + 1);
        } while (bVar26);
      }
      if (matrix_width != 0) {
        uVar24 = 1;
        lVar18 = 0;
        do {
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl;
          auVar32 = vpmaxsd_avx2(*(undefined1 (*) [32])((long)*pIVar8->E + lVar18),
                                 *(undefined1 (*) [32])((long)*pIVar8->Q + lVar18));
          uVar22 = (ulong)uVar24;
          uVar24 = uVar24 + 1;
          *(undefined1 (*) [32])((long)*pIVar8->H + lVar18) = auVar32;
          lVar18 = lVar18 + 0x20;
        } while (uVar22 < matrix_width);
      }
    }
    else if (AVar3 == kAffine) {
      if (matrix_height != 0) {
        uVar22 = 0;
        lVar18 = *(long *)&(((this->pimpl_)._M_t.
                             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             .
                             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                            ._M_head_impl)->first_column).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl;
        do {
          *(undefined4 *)(lVar18 + uVar22 * 4) =
               *(undefined4 *)(lVar18 + matrix_height * 4 + uVar22 * 4);
          uVar22 = uVar22 + 1;
        } while ((uVar22 & 0xffffffff) < matrix_height);
      }
      if (matrix_width != 0) {
        uVar24 = 1;
        lVar18 = 0;
        do {
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl;
          puVar20 = (undefined8 *)((long)*pIVar8->E + lVar18);
          uVar14 = puVar20[1];
          uVar15 = puVar20[2];
          uVar16 = puVar20[3];
          uVar22 = (ulong)uVar24;
          uVar24 = uVar24 + 1;
          puVar1 = (undefined8 *)((long)*pIVar8->H + lVar18);
          *puVar1 = *puVar20;
          puVar1[1] = uVar14;
          puVar1[2] = uVar15;
          puVar1[3] = uVar16;
          lVar18 = lVar18 + 0x20;
        } while (uVar22 < matrix_width);
      }
    }
  }
  else if (AVar4 == kSW) {
    if (matrix_width != 0) {
      uVar24 = 1;
      lVar18 = 0;
      do {
        puVar20 = (undefined8 *)
                  ((long)*((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->H + lVar18);
        *puVar20 = 0;
        puVar20[1] = 0;
        puVar20[2] = 0;
        puVar20[3] = 0;
        uVar22 = (ulong)uVar24;
        lVar18 = lVar18 + 0x20;
        uVar24 = uVar24 + 1;
      } while (uVar22 < matrix_width);
    }
    if (matrix_height != 0) {
      uVar22 = 0;
      lVar18 = *(long *)&(((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->first_column).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      do {
        *(undefined4 *)(lVar18 + uVar22 * 4) = 0;
        uVar22 = uVar22 + 1;
      } while ((uVar22 & 0xffffffff) < matrix_height);
    }
  }
  return;
}

Assistant:

void SimdAlignmentEngine<A>::Initialize(
    const char* sequence,
    const Graph& graph,
    std::uint64_t normal_matrix_width,
    std::uint64_t matrix_width,
    std::uint64_t matrix_height) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::int32_t padding_penatly = -1 * std::max(
      std::max(abs(m_), abs(n_)),
      std::max(abs(g_), abs(q_)));

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {};  // NOLINT

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    for (std::uint32_t j = 0; j < matrix_width; ++j) {
      for (std::uint32_t k = 0; k < T::kNumVar; ++k) {
        unpacked[k] = (j * T::kNumVar + k) < normal_matrix_width ?
            (c == sequence[j * T::kNumVar + k] ? m_ : n_) : padding_penatly;
      }
      pimpl_->sequence_profile[i * matrix_width + j] =
          _mmxxx_load_si(reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __mxxxi negative_infinities = T::_mmxxx_set1_epi(kNegativeInfinity);
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->O[j] = negative_infinities;
        pimpl_->Q[j] = T::_mmxxx_set1_epi(q_ + j * T::kNumVar * c_);

        __mxxxi c = T::_mmxxx_set1_epi(c_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          c = _mmxxx_slli_si(c, T::kLSS);
          pimpl_->Q[j] = T::_mmxxx_add_epi(pimpl_->Q[j], c);
        }
      }
      pimpl_->first_column[2 * matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[2 * matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[2 * matrix_height + i] = penalty + c_;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->F[j] = negative_infinities;
        pimpl_->E[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * e_);

        __mxxxi e = T::_mmxxx_set1_epi(e_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          e = _mmxxx_slli_si(e, T::kLSS);
          pimpl_->E[j] = T::_mmxxx_add_epi(pimpl_->E[j], e);
        }
      }
      pimpl_->first_column[matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[matrix_height + i] = penalty + e_;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->H[j] = zeroes;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = std::max(
                pimpl_->first_column[matrix_height + i],
                pimpl_->first_column[2 * matrix_height + i]);
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j], pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = pimpl_->first_column[matrix_height + i];
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          pimpl_->first_column[0] = 0;
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->first_column[pred_i]);
            }
            pimpl_->first_column[i] = penalty + g_;
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j],
            pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    default:
      break;
  }
#endif
  (void) sequence;
  (void) graph;
  (void) normal_matrix_width;
  (void) matrix_width;
  (void) matrix_height;
}